

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O0

void __thiscall Fl_FLTK_File_Chooser::parse_filter(Fl_FLTK_File_Chooser *this)

{
  char cVar1;
  char *pcVar2;
  char local_1039;
  char local_1031;
  char local_1028 [8];
  char comp [2048];
  char name [1024];
  char wildcard [1024];
  char local_1d;
  char mode;
  char *pcStack_18;
  int has_name;
  char *in;
  Fl_FLTK_File_Chooser *this_local;
  
  pcVar2 = strfree(this->_parsedfilt);
  this->_parsedfilt = pcVar2;
  this->_nfilters = 0;
  pcStack_18 = this->_filter;
  if (pcStack_18 == (char *)0x0) {
    return;
  }
  pcVar2 = strchr(pcStack_18,9);
  local_1031 = 'n';
  if (pcVar2 == (char *)0x0) {
    local_1031 = 'w';
  }
  local_1d = local_1031;
  memset(name + 0x3f8,0,0x400);
  memset(comp + 0x7f8,0,0x400);
  do {
    cVar1 = *pcStack_18;
    if (cVar1 == '\0') {
LAB_001cd7ce:
      if (name[0x3f8] != '\0') {
        pcVar2 = "";
        if (this->_parsedfilt != (char *)0x0) {
          pcVar2 = "\t";
        }
        sprintf(local_1028,"%s%.511s(%.511s)",pcVar2,comp + 0x7f8,name + 0x3f8);
        pcVar2 = strapp(this->_parsedfilt,local_1028);
        this->_parsedfilt = pcVar2;
        this->_nfilters = this->_nfilters + 1;
      }
      comp[0x7f8] = '\0';
      name[0x3f8] = '\0';
      pcVar2 = strchr(pcStack_18,9);
      local_1039 = 'n';
      if (pcVar2 == (char *)0x0) {
        local_1039 = 'w';
      }
      local_1d = local_1039;
      if (*pcStack_18 == '\0') {
        return;
      }
    }
    else {
      if (cVar1 == '\t') {
        if (local_1d == 'n') {
          local_1d = 'w';
          goto LAB_001cd8f1;
        }
      }
      else {
        if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_001cd7ce;
        if (cVar1 == '\\') {
          pcStack_18 = pcStack_18 + 1;
        }
      }
      if (local_1d == 'n') {
        chrcat(comp + 0x7f8,*pcStack_18);
      }
      else if (local_1d == 'w') {
        chrcat(name + 0x3f8,*pcStack_18);
      }
    }
LAB_001cd8f1:
    pcStack_18 = pcStack_18 + 1;
  } while( true );
}

Assistant:

void Fl_FLTK_File_Chooser::parse_filter() {
  _parsedfilt = strfree(_parsedfilt);	// clear previous parsed filter (if any)
  _nfilters = 0;
  char *in = _filter;
  if ( !in ) return;

  int has_name = strchr(in, '\t') ? 1 : 0;

  char mode = has_name ? 'n' : 'w';	// parse mode: n=title, w=wildcard
  char wildcard[1024] = "";		// parsed wildcard
  char name[1024] = "";

  // Parse filter user specified
  for ( ; 1; in++ ) {
    /*** DEBUG
    printf("WORKING ON '%c': mode=<%c> name=<%s> wildcard=<%s>\n",
			*in, mode,     name,     wildcard);
    ***/

    switch (*in) {
      // FINISHED PARSING NAME?
      case '\t':
        if ( mode != 'n' ) goto regchar;
        mode = 'w';
        break; 
      // ESCAPE NEXT CHAR
      case '\\':
	++in;
	goto regchar; 
      // FINISHED PARSING ONE OF POSSIBLY SEVERAL FILTERS?
      case '\r':
      case '\n':
      case '\0':
	// APPEND NEW FILTER TO LIST
	if ( wildcard[0] ) {
	  // OUT: "name(wild)\tname(wild)"
	  char comp[2048];
	  sprintf(comp, "%s%.511s(%.511s)", ((_parsedfilt)?"\t":""),
					    name, wildcard);
	  _parsedfilt = strapp(_parsedfilt, comp);
	  _nfilters++;
	  //DEBUG printf("DEBUG: PARSED FILT NOW <%s>\n", _parsedfilt);
	}
	// RESET
	wildcard[0] = name[0] = '\0';
	mode = strchr(in, '\t') ? 'n' : 'w';
	// DONE?
	if ( *in == '\0' ) return;	// done
	else continue;			// not done yet, more filters

      // Parse all other chars
      default:				// handle all non-special chars
      regchar:				// handle regular char
	switch ( mode ) {
	  case 'n': chrcat(name, *in);     continue;
	  case 'w': chrcat(wildcard, *in); continue;
	}
	break;
    }
  }
  //NOTREACHED
}